

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

bool Clasp::Cli::ClaspAppOptions::mappedOpts(ClaspAppOptions *this_,string *name,string *value)

{
  byte bVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  char *err;
  uint32 q [3];
  char *local_30;
  uint local_28 [4];
  
  iVar5 = std::__cxx11::string::compare((char *)name);
  if (iVar5 == 0) {
    local_30 = (char *)0x0;
    local_28[0] = 0xff;
    local_28[1] = 0xff;
    local_28[2] = 0xff;
    sVar6 = Potassco::convert_seq<unsigned_int,unsigned_int*>
                      ((value->_M_dataplus)._M_p,3,local_28,',',&local_30);
    if ((int)sVar6 != 0) {
      uVar7 = 0;
      do {
        this_->quiet[uVar7] = (uint8)local_28[uVar7];
        uVar7 = uVar7 + 1;
      } while ((sVar6 & 0xffffffff) != uVar7);
      if ((int)sVar6 != 0) {
        return *local_30 == '\0';
      }
    }
LAB_0011501d:
    bVar4 = false;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)name);
    if (iVar5 == 0) {
      if (value->_M_string_length - 3 < 0xfffffffffffffffe) goto LAB_0011501d;
      pcVar3 = (value->_M_dataplus)._M_p;
      if (value->_M_string_length == 1) {
        this_->ifs = *pcVar3;
      }
      else {
        bVar1 = pcVar3[1];
        if (bVar1 < 0x74) {
          if (bVar1 == 0x5c) {
            this_->ifs = '\\';
          }
          else {
            if (bVar1 != 0x6e) {
              return false;
            }
            this_->ifs = '\n';
          }
        }
        else if (bVar1 == 0x76) {
          this_->ifs = '\v';
        }
        else {
          if (bVar1 != 0x74) {
            return false;
          }
          this_->ifs = '\t';
        }
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)name);
      if (iVar5 == 0) {
        pcVar2 = (value->_M_dataplus)._M_p;
        iVar5 = strcasecmp(pcVar2,"output");
        (this_->lemma).domOut = iVar5 == 0;
        if (iVar5 != 0) {
          iVar5 = strcasecmp(pcVar2,"input");
          return iVar5 == 0;
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)name);
        if (iVar5 != 0) goto LAB_0011501d;
        pcVar2 = (value->_M_dataplus)._M_p;
        iVar5 = strcasecmp(pcVar2,"aspif");
        if (iVar5 == 0) {
          this_->onlyPre = '\x01';
        }
        else {
          iVar5 = strcasecmp(pcVar2,"smodels");
          if (iVar5 != 0) goto LAB_0011501d;
          this_->onlyPre = -1;
        }
      }
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool ClaspAppOptions::mappedOpts(ClaspAppOptions* this_, const std::string& name, const std::string& value) {
	if (name == "quiet") {
		const char* err = 0;
		uint32      q[3]= {uint32(UCHAR_MAX),uint32(UCHAR_MAX),uint32(UCHAR_MAX)};
		int      parsed = Potassco::xconvert(value.c_str(), q, &err);
		for (int i = 0; i != parsed; ++i) { this_->quiet[i] = static_cast<uint8>(q[i]); }
		return parsed && *err == 0;
	}
	else if (name == "out-ifs") {
		if (value.empty() || value.size() > 2) { return false;}
		if (value.size() == 1) { this_->ifs = value[0]; return true; }
		if (value[1] == 't')   { this_->ifs = '\t'; return true; }
		if (value[1] == 'n')   { this_->ifs = '\n'; return true; }
		if (value[1] == 'v')   { this_->ifs = '\v'; return true; }
		if (value[1] == '\\')  { this_->ifs = '\\'; return true; }
	}
	else if (name == "lemma-out-dom") {
		return (this_->lemma.domOut = (strcasecmp(value.c_str(), "output") == 0)) == true || strcasecmp(value.c_str(), "input") == 0;
	}
	else if (name == "pre") {
		if      (strcasecmp(value.c_str(), "aspif")   == 0) { this_->onlyPre = (int8)AspParser::format_aspif; return true; }
		else if (strcasecmp(value.c_str(), "smodels") == 0) { this_->onlyPre = (int8)AspParser::format_smodels; return true; }
	}
	return false;
}